

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_unittest.cpp
# Opt level: O3

void __thiscall SharedPtrUnitTest_use_count_Test::TestBody(SharedPtrUnitTest_use_count_Test *this)

{
  MyClass *pMVar1;
  pointer *__ptr;
  char *pcVar2;
  shared_ptr_t<MyClass> mc1;
  AssertHelper local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  shared_ptr<MyClass> local_28;
  
  local_28.ptr_ = (MyClass *)0x0;
  local_28.control_block_ptr_ = (control_block *)0x0;
  local_48._0_4_ = 0;
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_38,"mc1.use_count()","0",(uint *)local_48,(int *)&local_58);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT44(local_48._4_4_,local_48._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48._4_4_,local_48._0_4_) + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1);
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)local_38,pMVar1);
  estl::shared_ptr<MyClass>::operator=(&local_28,(shared_ptr<MyClass> *)local_38);
  estl::shared_ptr<MyClass>::decrease_counters((shared_ptr<MyClass> *)local_38);
  if (local_28.ptr_ == (MyClass *)0x0) {
    local_48._0_4_ = 0;
  }
  else {
    local_48._0_4_ =
         ((local_28.control_block_ptr_)->use_count_).super___atomic_base<unsigned_int>._M_i;
  }
  local_58.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_38,"mc1.use_count()","1",(uint *)local_48,(int *)&local_58);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT44(local_48._4_4_,local_48._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48._4_4_,local_48._0_4_) + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  local_38 = (undefined1  [8])local_28.ptr_;
  pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_28.control_block_ptr_;
  estl::shared_ptr<MyClass>::increase_counters((shared_ptr<MyClass> *)local_38);
  if (local_28.ptr_ == (MyClass *)0x0) {
    local_58.data_._0_4_ = 0;
  }
  else {
    local_58.data_._0_4_ =
         ((local_28.control_block_ptr_)->use_count_).super___atomic_base<unsigned_int>._M_i;
  }
  local_50.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"mc1.use_count()","2",(uint *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1);
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)local_48,pMVar1);
  estl::shared_ptr<MyClass>::operator=
            ((shared_ptr<MyClass> *)local_38,(shared_ptr<MyClass> *)local_48);
  estl::shared_ptr<MyClass>::decrease_counters((shared_ptr<MyClass> *)local_48);
  if (local_28.ptr_ == (MyClass *)0x0) {
    local_58.data_._0_4_ = 0;
  }
  else {
    local_58.data_._0_4_ =
         ((local_28.control_block_ptr_)->use_count_).super___atomic_base<unsigned_int>._M_i;
  }
  local_50.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"mc1.use_count()","1",(uint *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (local_38 == (undefined1  [8])0x0) {
    local_58.data_._0_4_ = 0;
  }
  else {
    local_58.data_._0_4_ =
         (((use_counter_type *)&pbStack_30->_M_dataplus)->super___atomic_base<unsigned_int>)._M_i;
  }
  local_50.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"mc2.use_count()","1",(uint *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  estl::shared_ptr<MyClass>::destroy(&local_28);
  if (local_28.ptr_ == (MyClass *)0x0) {
    local_58.data_._0_4_ = 0;
  }
  else {
    local_58.data_._0_4_ =
         ((local_28.control_block_ptr_)->use_count_).super___atomic_base<unsigned_int>._M_i;
  }
  local_50.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"mc1.use_count()","0",(uint *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (local_38 == (undefined1  [8])0x0) {
    local_58.data_._0_4_ = 0;
  }
  else {
    local_58.data_._0_4_ =
         (((use_counter_type *)&pbStack_30->_M_dataplus)->super___atomic_base<unsigned_int>)._M_i;
  }
  local_50.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"mc2.use_count()","1",(uint *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/memory/unittest/shared_ptr_unittest.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,(__int_type)local_58.data_) + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  estl::shared_ptr<MyClass>::decrease_counters((shared_ptr<MyClass> *)local_38);
  estl::shared_ptr<MyClass>::decrease_counters(&local_28);
  return;
}

Assistant:

void val(int val)
    {
        val_ = val;
    }